

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReportErrorIfHasExtraArraynessForOtherEntry
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  bool bVar1;
  IRContext *this_00;
  MessageConsumer *this_01;
  char *__args_3;
  spv_position_t local_b0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_51;
  string local_50 [8];
  string message;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_28;
  Instruction *local_20;
  Instruction *var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  local_20 = var;
  var_local = (Instruction *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::find(&this->vars_with_extra_arrayness,&local_20);
  message.field_2._8_8_ =
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&this->vars_with_extra_arrayness);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)
                     ((long)&message.field_2 + 8));
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,
               "A variable is arrayed for an entry point but it is not arrayed for another entry point"
               ,&local_51);
    std::allocator<char>::~allocator(&local_51);
    Instruction::PrettyPrint_abi_cxx11_(&local_98,local_20,0x40);
    std::operator+(&local_78,"\n  ",&local_98);
    std::__cxx11::string::operator+=(local_50,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::consumer(this_00);
    memset(&local_b0,0,0x18);
    __args_3 = (char *)std::__cxx11::string::c_str();
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(this_01,SPV_MSG_ERROR,"",&local_b0,__args_3);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string(local_50);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReportErrorIfHasExtraArraynessForOtherEntry(Instruction* var) {
  if (vars_with_extra_arrayness.find(var) == vars_with_extra_arrayness.end())
    return false;

  std::string message(
      "A variable is arrayed for an entry point but it is not "
      "arrayed for another entry point");
  message +=
      "\n  " + var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return true;
}